

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

string * __thiscall
just::process::exit_reason_abi_cxx11_(string *__return_storage_ptr__,process *this,int status_)

{
  ostream *poVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  uVar3 = (uint)this & 0x7f;
  if ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000) {
    if ((char)this < '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "\nProcess core dumped.";
      pcVar2 = "";
    }
    else {
      if (uVar3 == 0x7f) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"\nProcess was stopped with signal ",0x21);
        poVar1 = (ostream *)
                 std::ostream::operator<<((ostream *)local_190,(uint)(byte)((ulong)this >> 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
        std::__cxx11::stringbuf::str();
        goto LAB_00104a79;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = "";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\nProcess died due to unhandled signal ",0x26);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
    std::__cxx11::stringbuf::str();
LAB_00104a79:
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string exit_reason(int status_)
    {
      if (WIFSIGNALED(status_))
      {
        std::ostringstream s;
        s << "\nProcess died due to unhandled signal " << WTERMSIG(status_)
          << ".";
        return s.str();
      }
      else if (WCOREDUMP(status_))
      {
        return "\nProcess core dumped.";
      }
      else if (WIFSTOPPED(status_))
      {
        std::ostringstream s;
        s << "\nProcess was stopped with signal " << WSTOPSIG(status_) << ".";
        return s.str();
      }
      else
      {
        return "";
      }
    }